

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall TCMallocTest_HugeThreadCache_Test::TestBody(TCMallocTest_HugeThreadCache_Test *this)

{
  void *pvVar1;
  void *pvVar2;
  int i;
  long lVar3;
  
  puts("==== Testing huge thread cache");
  pvVar1 = operator_new__(560000);
  lVar3 = 0;
  do {
    pvVar2 = operator_new__(10);
    *(void **)((long)pvVar1 + lVar3 * 8) = pvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 70000);
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)pvVar1 + lVar3 * 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 70000);
  operator_delete__(pvVar1);
  return;
}

Assistant:

TEST(TCMallocTest, HugeThreadCache) {
  printf("==== Testing huge thread cache\n");
  // More than 2^16 to cause integer overflow of 16 bit counters.
  static const int kNum = 70000;
  char** array = new char*[kNum];
  for (int i = 0; i < kNum; ++i) {
    array[i] = new char[10];
  }
  for (int i = 0; i < kNum; ++i) {
    delete[] array[i];
  }
  delete[] array;
}